

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  uint uVar3;
  int iVar4;
  ImU32 IVar5;
  GetterXsYs<unsigned_int> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  GetterXsYRef<unsigned_int> *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  long lVar17;
  ImDrawIdx IVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pIVar14 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar16 = pGVar6->Count;
  lVar17 = (long)(((pGVar6->Offset + prim) % iVar16 + iVar16) % iVar16) * (long)pGVar6->Stride;
  uVar3 = *(uint *)((long)pGVar6->Ys + lVar17);
  dVar20 = log10((double)*(uint *)((long)pGVar6->Xs + lVar17) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar15 = GImPlot;
  pIVar8 = pIVar14->CurrentPlot;
  dVar1 = (pIVar8->XAxis).Range.Min;
  iVar16 = pTVar7->YAxis;
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar4 = pGVar9->Count;
  IVar2 = pIVar14->PixelRange[iVar16].Min;
  fVar23 = (float)(pIVar14->My[iVar16] * ((double)uVar3 - pIVar8->YAxis[iVar16].Range.Min) +
                  (double)IVar2.y);
  fVar24 = (float)(pIVar14->Mx *
                   (((double)(float)(dVar20 / pIVar14->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.x);
  dVar1 = pGVar9->YRef;
  dVar21 = log10((double)*(uint *)((long)pGVar9->Xs +
                                  (long)(((prim + pGVar9->Offset) % iVar4 + iVar4) % iVar4) *
                                  (long)pGVar9->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar15->CurrentPlot;
  dVar20 = (pIVar8->XAxis).Range.Min;
  iVar16 = pTVar7->YAxis;
  IVar2 = pIVar15->PixelRange[iVar16].Min;
  fVar19 = (float)(pIVar15->Mx *
                   (((double)(float)(dVar21 / pIVar15->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar20) + dVar20) - dVar20) + (double)IVar2.x);
  fVar22 = (float)(pIVar15->My[iVar16] * (dVar1 - pIVar8->YAxis[iVar16].Range.Min) + (double)IVar2.y
                  );
  auVar28._0_4_ = ~-(uint)(fVar19 <= fVar24) & (uint)fVar19;
  auVar28._4_4_ = ~-(uint)(fVar22 <= fVar23) & (uint)fVar22;
  auVar28._8_4_ = ~-(uint)(fVar24 < fVar19) & (uint)fVar19;
  auVar28._12_4_ = ~-(uint)(fVar23 < fVar22) & (uint)fVar22;
  auVar12._4_4_ = (uint)fVar23 & -(uint)(fVar22 <= fVar23);
  auVar12._0_4_ = (uint)fVar24 & -(uint)(fVar19 <= fVar24);
  auVar12._8_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar19);
  auVar12._12_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar22);
  auVar28 = auVar28 | auVar12;
  fVar25 = (cull_rect->Min).y;
  auVar30._4_4_ = -(uint)(fVar25 < auVar28._4_4_);
  auVar30._0_4_ = -(uint)((cull_rect->Min).x < auVar28._0_4_);
  auVar13._4_8_ = auVar28._8_8_;
  auVar13._0_4_ = -(uint)(auVar28._4_4_ < fVar25);
  auVar29._0_8_ = auVar13._0_8_ << 0x20;
  auVar29._8_4_ = -(uint)(auVar28._8_4_ < (cull_rect->Max).x);
  auVar29._12_4_ = -(uint)(auVar28._12_4_ < (cull_rect->Max).y);
  auVar30._8_8_ = auVar29._8_8_;
  iVar16 = movmskps((int)cull_rect,auVar30);
  if (iVar16 == 0xf) {
    IVar5 = this->Col;
    IVar2 = *uv;
    fVar25 = fVar19 - fVar24;
    fVar26 = fVar22 - fVar23;
    fVar27 = fVar25 * fVar25 + fVar26 * fVar26;
    if (0.0 < fVar27) {
      fVar27 = 1.0 / SQRT(fVar27);
      fVar25 = fVar25 * fVar27;
      fVar26 = fVar26 * fVar27;
    }
    fVar27 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    fVar25 = fVar27 * fVar25;
    fVar27 = fVar27 * fVar26;
    (pIVar10->pos).x = fVar27 + fVar24;
    (pIVar10->pos).y = fVar23 - fVar25;
    (pIVar10->uv).x = IVar2.x;
    (pIVar10->uv).y = IVar2.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar27 + fVar19;
    pIVar10[1].pos.y = fVar22 - fVar25;
    pIVar10[1].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar19 - fVar27;
    pIVar10[2].pos.y = fVar22 + fVar25;
    pIVar10[2].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar24 - fVar27;
    pIVar10[3].pos.y = fVar25 + fVar23;
    pIVar10[3].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar3;
    *pIVar11 = IVar18;
    pIVar11[1] = IVar18 + 1;
    pIVar11[2] = IVar18 + 2;
    pIVar11[3] = IVar18;
    pIVar11[4] = IVar18 + 2;
    pIVar11[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar3 + 4;
  }
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }